

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O2

void cursespp::SchemaOverlay::Show
               (string *title,PrefsPtr *prefs,SchemaPtr *schema,function<void_(bool)> *callback)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  SchemaAdapter *this;
  ListOverlay *pLVar3;
  OverlayStack *this_00;
  __shared_ptr<SchemaAdapter,_(__gnu_cxx::_Lock_policy)2> local_118;
  shared_ptr<SchemaAdapter> schemaAdapter;
  shared_ptr<cursespp::ListOverlay> dialog;
  _Any_data local_e8;
  long local_d8;
  undefined8 uStack_d0;
  __shared_ptr<SchemaAdapter,_(__gnu_cxx::_Lock_policy)2> local_c8;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  __shared_ptr<cursespp::ILayout,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<cursespp::IScrollAdapter,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this = (SchemaAdapter *)operator_new(0x80);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&schema->super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>);
  SchemaAdapter::SchemaAdapter(this,(PrefsPtr *)&local_40,(SchemaPtr *)&local_50);
  std::__shared_ptr<SchemaAdapter,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SchemaAdapter,void>
            ((__shared_ptr<SchemaAdapter,(__gnu_cxx::_Lock_policy)2> *)&schemaAdapter,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  pLVar3 = (ListOverlay *)operator_new(0x360);
  ListOverlay::ListOverlay(pLVar3);
  std::__shared_ptr<cursespp::ListOverlay,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ListOverlay,void>
            ((__shared_ptr<cursespp::ListOverlay,(__gnu_cxx::_Lock_policy)2> *)&dialog,pLVar3);
  std::__shared_ptr<cursespp::IScrollAdapter,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<SchemaAdapter,void>
            (local_60,&schemaAdapter.super___shared_ptr<SchemaAdapter,_(__gnu_cxx::_Lock_policy)2>);
  pLVar3 = ListOverlay::SetAdapter
                     (dialog.super___shared_ptr<cursespp::ListOverlay,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(IScrollAdapterPtr *)local_60);
  pLVar3 = ListOverlay::SetTitle(pLVar3,title);
  pLVar3 = ListOverlay::SetWidthPercent(pLVar3,0x50);
  pLVar3 = ListOverlay::SetAutoDismiss(pLVar3,false);
  std::__shared_ptr<SchemaAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_118,&schemaAdapter.super___shared_ptr<SchemaAdapter,_(__gnu_cxx::_Lock_policy)2>
            );
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_118._M_refcount._M_pi;
  peVar1 = local_118._M_ptr;
  local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._M_ptr = (element_type *)0x0;
  *(element_type **)local_98._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_98._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_80 = std::
               _Function_handler<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:408:13)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:408:13)>
             ::_M_manager;
  pLVar3 = ListOverlay::SetItemSelectedCallback(pLVar3,(ItemSelectedCallback *)&local_98);
  std::function<void_(bool)>::function((function<void_(bool)> *)&local_e8,callback);
  std::__shared_ptr<SchemaAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,&schemaAdapter.super___shared_ptr<SchemaAdapter,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x30);
  _Var2._M_pi = local_c8._M_refcount._M_pi;
  peVar1 = local_c8._M_ptr;
  *(undefined8 *)local_b8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x18) = uStack_d0;
  if (local_d8 != 0) {
    *(void **)local_b8._M_unused._0_8_ = local_e8._M_unused._M_object;
    *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = local_e8._8_8_;
    *(long *)((long)local_b8._M_unused._0_8_ + 0x10) = local_d8;
    local_d8 = 0;
    uStack_d0 = 0;
  }
  local_c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8._M_ptr = (element_type *)0x0;
  *(element_type **)((long)local_b8._M_unused._0_8_ + 0x20) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b8._M_unused._0_8_ + 0x28) =
       _Var2._M_pi;
  pcStack_a0 = std::
               _Function_handler<void_(cursespp::ListOverlay_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:411:31)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(cursespp::ListOverlay_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:411:31)>
             ::_M_manager;
  ListOverlay::SetDismissedCallback(pLVar3,(DismissedCallback *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  Show(std::__cxx11::string_const&,std::shared_ptr<f8n::prefs::Preferences>,std::shared_ptr<f8n::sdk::ISchema>,std::function<void(bool)>)
  ::$_1::~__1((__1 *)local_e8._M_pod_data);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  this_00 = App::Overlays();
  std::__shared_ptr<cursespp::ILayout,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ListOverlay,void>
            (local_70,&dialog.super___shared_ptr<cursespp::ListOverlay,_(__gnu_cxx::_Lock_policy)2>)
  ;
  OverlayStack::Push(this_00,(ILayoutPtr *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dialog.super___shared_ptr<cursespp::ListOverlay,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&schemaAdapter.super___shared_ptr<SchemaAdapter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void SchemaOverlay::Show(
    const std::string& title,
    PrefsPtr prefs,
    SchemaPtr schema,
    std::function<void(bool)> callback)
{
    std::shared_ptr<SchemaAdapter> schemaAdapter(new SchemaAdapter(prefs, schema));
    std::shared_ptr<ListOverlay> dialog(new ListOverlay());

    dialog->SetAdapter(schemaAdapter)
        .SetTitle(title)
        .SetWidthPercent(80)
        .SetAutoDismiss(false)
        .SetItemSelectedCallback(
            [schemaAdapter](ListOverlay* overlay, IScrollAdapterPtr adapter, size_t index) {
                schemaAdapter->ShowOverlay(index);
            })
        .SetDismissedCallback([callback, schemaAdapter](ListOverlay* overlay) {
                if (callback) {
                    callback(schemaAdapter->Changed());
                }
            });

    cursespp::App::Overlays().Push(dialog);
}